

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O0

Extension deqp::egl::anon_unknown_0::getSyncTypeExtension(EGLenum syncType)

{
  undefined4 local_c;
  EGLenum syncType_local;
  
  if (syncType == 0x30f9) {
    local_c = EXTENSION_FENCE_SYNC;
  }
  else if (syncType == 0x30fa) {
    local_c = EXTENSION_REUSABLE_SYNC;
  }
  else {
    local_c = EXTENSION_NONE;
  }
  return local_c;
}

Assistant:

SyncTest::Extension getSyncTypeExtension (EGLenum syncType)
{
	switch (syncType)
	{
		case EGL_SYNC_FENCE_KHR:	return SyncTest::EXTENSION_FENCE_SYNC;
		case EGL_SYNC_REUSABLE_KHR:	return SyncTest::EXTENSION_REUSABLE_SYNC;
		default:
			DE_ASSERT(DE_FALSE);
			return SyncTest::EXTENSION_NONE;
	}
}